

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pjson.h
# Opt level: O1

bool __thiscall pjson::document::deserialize_internal(document *this)

{
  float fVar1;
  json_value_type_t jVar2;
  uint8 *puVar3;
  double dVar4;
  undefined8 uVar5;
  key_value_t *pkVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  uint8 *puVar10;
  void *__dest;
  ulong __size;
  byte *pbVar11;
  char *pcVar12;
  byte *pbVar13;
  byte bVar14;
  int iVar15;
  size_t sVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  byte *pbVar23;
  uint uVar24;
  byte *pbVar25;
  ulong uVar26;
  char cVar27;
  double dVar28;
  long lVar29;
  byte *pbVar30;
  byte bVar31;
  double *unaff_R15;
  bool bVar32;
  double dVar33;
  undefined1 auVar34 [16];
  undefined4 local_6c;
  
  puVar10 = (this->m_stack).m_pBuf;
  uVar26 = (this->m_stack).m_size;
  (this->m_stack).m_ofs = 0x24;
  if (uVar26 < 0x24) {
    (this->m_stack).m_ofs = 0;
    uVar18 = 1;
    if (uVar26 != 0) {
      uVar18 = uVar26 * 2;
    }
    do {
      uVar26 = uVar18;
      uVar18 = uVar26 * 2;
    } while (uVar26 < 0x25);
    (this->m_stack).m_size = uVar26;
    puVar10 = (uint8 *)realloc(puVar10,uVar26);
    (this->m_stack).m_pBuf = puVar10;
    sVar16 = (this->m_stack).m_ofs;
    puVar10 = puVar10 + sVar16;
    (this->m_stack).m_ofs = sVar16 + 0x24;
  }
  if ((this->m_stack).m_size < (this->m_stack).m_ofs) {
LAB_001062c7:
    pcVar12 = "T *pjson::growable_stack::push(uint) [T = pjson::value_variant]";
LAB_001062f3:
    __assert_fail("m_ofs <= m_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/0x000N3X4N[P]anonfile/json_handler/../pjson/pjson.h"
                  ,0x661,pcVar12);
  }
  *(undefined4 *)(puVar10 + 0x20) =
       *(undefined4 *)((long)&(this->super_value_variant).super_value_variant_data.m_pBufEnd + 4);
  pkVar6 = (this->super_value_variant).super_value_variant_data.m_data.m_object.m_p;
  uVar5 = *(undefined8 *)((long)&(this->super_value_variant).super_value_variant_data.m_data + 8);
  uVar7 = *(undefined8 *)
           ((long)&(this->super_value_variant).super_value_variant_data.m_pBufStart + 4);
  *(undefined8 *)(puVar10 + 0x10) =
       *(undefined8 *)&(this->super_value_variant).super_value_variant_data.m_type;
  *(undefined8 *)(puVar10 + 0x18) = uVar7;
  *(key_value_t **)puVar10 = pkVar6;
  *(undefined8 *)(puVar10 + 8) = uVar5;
  pbVar23 = this->m_pStr + 1;
  this->m_pStr = pbVar23;
  jVar2 = (this->super_value_variant).super_value_variant_data.m_type;
  dVar28 = (double)(ulong)(jVar2 == cJSONValueTypeObject);
  bVar31 = (jVar2 != cJSONValueTypeArray) << 5 | 0x5d;
  iVar22 = 0;
  local_6c = SUB84(&this->m_allocator,0);
LAB_00104e82:
  do {
    if ((globals_struct<void>::s_parse_flags[*pbVar23] & 4) != 0) {
      do {
        if ((globals_struct<void>::s_parse_flags[pbVar23[1]] & 4) == 0) {
          pbVar23 = pbVar23 + 1;
          break;
        }
        if ((globals_struct<void>::s_parse_flags[pbVar23[2]] & 4) == 0) {
          pbVar23 = pbVar23 + 2;
          break;
        }
        if ((globals_struct<void>::s_parse_flags[pbVar23[3]] & 4) == 0) {
          pbVar23 = pbVar23 + 3;
          break;
        }
        pbVar30 = pbVar23 + 4;
        pbVar23 = pbVar23 + 4;
      } while ((globals_struct<void>::s_parse_flags[*pbVar30] & 4) != 0);
      if ((*pbVar23 == 0x2f) && (pbVar23[1] == 0x2f)) {
        pbVar23 = pbVar23 + 2;
        while ((0xd < *pbVar23 || ((0x2401U >> (*pbVar23 & 0x1f) & 1) == 0))) {
          pbVar23 = pbVar23 + 1;
        }
        goto LAB_00104e82;
      }
    }
    bVar14 = *pbVar23;
    uVar24 = (uint)bVar14;
    if (bVar14 == 0x2c) {
      if (iVar22 == 0) {
        this->m_pStr = pbVar23;
        (this->m_error_info).m_ofs = (long)pbVar23 - (long)this->m_pStart;
        (this->m_error_info).m_pError_message = "Unexpected comma";
        iVar22 = 0;
        goto LAB_001053a0;
      }
      bVar14 = pbVar23[1];
      pbVar23 = pbVar23 + 1;
      while ((globals_struct<void>::s_parse_flags[bVar14] & 4) != 0) {
        do {
          if ((globals_struct<void>::s_parse_flags[pbVar23[1]] & 4) == 0) {
            pbVar23 = pbVar23 + 1;
            break;
          }
          if ((globals_struct<void>::s_parse_flags[pbVar23[2]] & 4) == 0) {
            pbVar23 = pbVar23 + 2;
            break;
          }
          if ((globals_struct<void>::s_parse_flags[pbVar23[3]] & 4) == 0) {
            pbVar23 = pbVar23 + 3;
            break;
          }
          pbVar30 = pbVar23 + 4;
          pbVar23 = pbVar23 + 4;
        } while ((globals_struct<void>::s_parse_flags[*pbVar30] & 4) != 0);
        if ((*pbVar23 != 0x2f) || (pbVar23[1] != 0x2f)) break;
        pbVar23 = pbVar23 + 2;
        while ((0xd < *pbVar23 || ((0x2401U >> (*pbVar23 & 0x1f) & 1) == 0))) {
          pbVar23 = pbVar23 + 1;
        }
        bVar14 = *pbVar23;
      }
      uVar24 = (uint)*pbVar23;
LAB_00104fb1:
      if ((byte)uVar24 == bVar31) {
        do {
          pbVar23 = pbVar23 + 1;
          iVar20 = iVar22;
          do {
            uVar18 = (ulong)((SUB84(dVar28,0) << 4 | 0x24U) * iVar20);
            uVar26 = (this->m_stack).m_ofs;
            sVar16 = uVar26 - uVar18;
            if (uVar26 < uVar18) {
              __assert_fail("bytes_needed <= m_ofs",
                            "/workspace/llm4binary/github/license_c_cmakelists/0x000N3X4N[P]anonfile/json_handler/../pjson/pjson.h"
                            ,0x669,"T *pjson::growable_stack::pop(uint) [T = unsigned char]");
            }
            (this->m_stack).m_ofs = sVar16;
            puVar3 = (this->m_stack).m_pBuf;
            lVar29 = *(long *)(puVar3 + (sVar16 - 0x24));
            dVar28 = (double)(ulong)(lVar29 != 0);
            iVar22 = *(int *)(puVar3 + (sVar16 - 0x1c));
            *(int *)(puVar3 + (sVar16 - 0x1c)) = iVar20;
            puVar10 = puVar3 + (sVar16 - 0x24);
            puVar10[0] = '\0';
            puVar10[1] = '\0';
            puVar10[2] = '\0';
            puVar10[3] = '\0';
            puVar10[4] = '\0';
            puVar10[5] = '\0';
            puVar10[6] = '\0';
            puVar10[7] = '\0';
            if (uVar18 != 0) {
              __dest = pool_allocator::Alloc(&this->m_allocator,uVar18);
              *(void **)(puVar3 + sVar16 + -0x24) = __dest;
              memcpy(__dest,puVar3 + sVar16,uVar18);
            }
            bVar31 = (lVar29 != 0) << 5 | 0x5d;
            uVar26 = (this->m_stack).m_ofs;
            if (uVar26 < 0x25) {
              if (uVar26 != 0x24) {
                __assert_fail("m_stack.get_ofs() == sizeof(value_variant)",
                              "/workspace/llm4binary/github/license_c_cmakelists/0x000N3X4N[P]anonfile/json_handler/../pjson/pjson.h"
                              ,0x738,"bool pjson::document::deserialize_internal()");
              }
              (this->m_stack).m_ofs = 0;
              puVar10 = (this->m_stack).m_pBuf;
              uVar5 = *(undefined8 *)(puVar10 + 8);
              uVar7 = *(undefined8 *)(puVar10 + 0x10);
              uVar8 = *(undefined8 *)(puVar10 + 0x18);
              (this->super_value_variant).super_value_variant_data.m_data.m_object.m_p =
                   *(key_value_t **)puVar10;
              *(undefined8 *)
               ((long)&(this->super_value_variant).super_value_variant_data.m_data + 8) = uVar5;
              *(undefined8 *)&(this->super_value_variant).super_value_variant_data.m_type = uVar7;
              *(undefined8 *)
               ((long)&(this->super_value_variant).super_value_variant_data.m_pBufStart + 4) = uVar8
              ;
              *(undefined4 *)
               ((long)&(this->super_value_variant).super_value_variant_data.m_pBufEnd + 4) =
                   *(undefined4 *)(puVar10 + 0x20);
              this->m_pStr = pbVar23;
              local_6c = 1;
              iVar15 = 1;
LAB_001051cb:
              bVar32 = false;
            }
            else {
              if ((globals_struct<void>::s_parse_flags[*pbVar23] & 4) != 0) {
LAB_001050cf:
                do {
                  if ((globals_struct<void>::s_parse_flags[pbVar23[1]] & 4) == 0) {
                    pbVar23 = pbVar23 + 1;
                  }
                  else if ((globals_struct<void>::s_parse_flags[pbVar23[2]] & 4) == 0) {
                    pbVar23 = pbVar23 + 2;
                  }
                  else if ((globals_struct<void>::s_parse_flags[pbVar23[3]] & 4) == 0) {
                    pbVar23 = pbVar23 + 3;
                  }
                  else {
                    pbVar30 = pbVar23 + 4;
                    pbVar23 = pbVar23 + 4;
                    if ((globals_struct<void>::s_parse_flags[*pbVar30] & 4) != 0) goto LAB_001050cf;
                  }
                  if ((*pbVar23 != 0x2f) || (pbVar23[1] != 0x2f)) break;
                  pbVar23 = pbVar23 + 2;
                  while ((0xd < *pbVar23 || ((0x2401U >> (*pbVar23 & 0x1f) & 1) == 0))) {
                    pbVar23 = pbVar23 + 1;
                  }
                  if ((globals_struct<void>::s_parse_flags[*pbVar23] & 4) == 0) break;
                } while( true );
              }
              bVar14 = *pbVar23;
              pbVar23 = pbVar23 + 1;
              if (bVar14 == 0x2c) {
                while ((globals_struct<void>::s_parse_flags[*pbVar23] & 4) != 0) {
                  do {
                    if ((globals_struct<void>::s_parse_flags[pbVar23[1]] & 4) == 0) {
                      pbVar23 = pbVar23 + 1;
                      break;
                    }
                    if ((globals_struct<void>::s_parse_flags[pbVar23[2]] & 4) == 0) {
                      pbVar23 = pbVar23 + 2;
                      break;
                    }
                    if ((globals_struct<void>::s_parse_flags[pbVar23[3]] & 4) == 0) {
                      pbVar23 = pbVar23 + 3;
                      break;
                    }
                    pbVar30 = pbVar23 + 4;
                    pbVar23 = pbVar23 + 4;
                  } while ((globals_struct<void>::s_parse_flags[*pbVar30] & 4) != 0);
                  if ((*pbVar23 != 0x2f) || (pbVar23[1] != 0x2f)) break;
                  pbVar23 = pbVar23 + 2;
                  while ((0xd < *pbVar23 || ((0x2401U >> (*pbVar23 & 0x1f) & 1) == 0))) {
                    pbVar23 = pbVar23 + 1;
                  }
                }
                uVar24 = (uint)*pbVar23;
                iVar15 = 0x38;
                goto LAB_001051cb;
              }
              if (bVar14 == bVar31) {
                iVar15 = 0;
                bVar32 = true;
              }
              else {
                this->m_pStr = pbVar23;
                (this->m_error_info).m_ofs = (long)pbVar23 - (long)this->m_pStart;
                (this->m_error_info).m_pError_message =
                     "Unexpected character within object or array";
                iVar15 = 1;
                bVar32 = false;
                local_6c = 0;
              }
            }
            iVar20 = iVar22;
          } while (iVar15 == 0);
          if (iVar15 != 0x38) {
            dVar28 = (double)(ulong)(lVar29 != 0);
            goto LAB_001053a8;
          }
        } while ((byte)uVar24 == bVar31);
        dVar28 = (double)(ulong)(lVar29 != 0);
      }
      iVar22 = iVar22 + 1;
      if (dVar28 == 0.0) {
        puVar10 = (this->m_stack).m_pBuf;
        uVar18 = (this->m_stack).m_size;
        sVar16 = (this->m_stack).m_ofs;
        uVar26 = sVar16 + 0x24;
        (this->m_stack).m_ofs = uVar26;
        if (uVar18 < uVar26) {
          (this->m_stack).m_ofs = sVar16;
          lVar29 = uVar18 * 2;
          uVar18 = lVar29 + (ulong)(lVar29 == 0);
          do {
            uVar21 = uVar18;
            uVar18 = uVar21 * 2;
          } while (uVar21 <= uVar26);
          (this->m_stack).m_size = uVar21;
          puVar10 = (uint8 *)realloc(puVar10,uVar21);
          (this->m_stack).m_pBuf = puVar10;
          sVar16 = (this->m_stack).m_ofs;
          unaff_R15 = (double *)(puVar10 + sVar16);
          (this->m_stack).m_ofs = sVar16 + 0x24;
        }
        else {
          unaff_R15 = (double *)(puVar10 + sVar16);
        }
        pbVar30 = pbVar23;
        if ((this->m_stack).m_size < (this->m_stack).m_ofs) goto LAB_001062c7;
LAB_0010589d:
        cVar27 = (char)uVar24;
        pbVar23 = pbVar30;
        if (uVar24 < 0x6e) {
          uVar26 = (ulong)(uVar24 - 0x2d);
          if (uVar24 - 0x2d < 0x3a) {
            if ((0x1ffbUL >> (uVar26 & 0x3f) & 1) != 0) {
              bVar32 = cVar27 == '-';
              uVar26 = (ulong)bVar32;
              bVar14 = pbVar30[uVar26];
              uVar18 = (ulong)bVar14;
              pbVar23 = pbVar30 + uVar26;
              *(byte **)((long)unaff_R15 + 0x14) = pbVar23;
              if ((globals_struct<void>::s_parse_flags[uVar18] & 8) == 0) {
                uVar24 = 0;
              }
              else {
                uVar24 = bVar14 - 0x30;
                uVar18 = (ulong)pbVar23[1];
                if ((globals_struct<void>::s_parse_flags[uVar18] & 8) == 0) {
                  pbVar23 = pbVar23 + 1;
                }
                else {
                  uVar24 = ((uint)pbVar23[1] + uVar24 * 10) - 0x30;
                  uVar18 = (ulong)pbVar23[2];
                  if ((globals_struct<void>::s_parse_flags[uVar18] & 8) == 0) {
                    pbVar23 = pbVar23 + 2;
                  }
                  else {
                    uVar24 = ((uint)pbVar23[2] + uVar24 * 10) - 0x30;
                    uVar18 = (ulong)pbVar23[3];
                    if ((globals_struct<void>::s_parse_flags[uVar18] & 8) == 0) {
                      pbVar23 = pbVar23 + 3;
                    }
                    else {
                      uVar24 = ((uint)pbVar23[3] + uVar24 * 10) - 0x30;
                      uVar18 = (ulong)pbVar23[4];
                      if ((globals_struct<void>::s_parse_flags[uVar18] & 8) == 0) {
                        pbVar23 = pbVar23 + 4;
                      }
                      else {
                        uVar24 = ((uint)pbVar23[4] + uVar24 * 10) - 0x30;
                        uVar18 = (ulong)pbVar23[5];
                        if ((globals_struct<void>::s_parse_flags[uVar18] & 8) == 0) {
                          pbVar23 = pbVar23 + 5;
                        }
                        else {
                          uVar24 = ((uint)pbVar23[5] + uVar24 * 10) - 0x30;
                          uVar18 = (ulong)pbVar23[6];
                          if ((globals_struct<void>::s_parse_flags[uVar18] & 8) == 0) {
                            pbVar23 = pbVar23 + 6;
                          }
                          else {
                            uVar24 = ((uint)pbVar23[6] + uVar24 * 10) - 0x30;
                            uVar18 = (ulong)pbVar23[7];
                            if ((globals_struct<void>::s_parse_flags[uVar18] & 8) == 0) {
                              pbVar23 = pbVar23 + 7;
                            }
                            else {
                              uVar24 = ((uint)pbVar23[7] + uVar24 * 10) - 0x30;
                              uVar18 = (ulong)pbVar23[8];
                              pbVar23 = pbVar23 + 8;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              if ((globals_struct<void>::s_parse_flags[uVar18] & 0x10) == 0) {
                *(undefined4 *)(unaff_R15 + 2) = 2;
                *unaff_R15 = (double)(long)(int)((uVar24 ^ -(uint)bVar32) + (uint)bVar32);
              }
              else {
                uVar21 = (ulong)uVar24;
                pbVar23 = pbVar23 + 1;
                while ((globals_struct<void>::s_parse_flags[uVar18] & 8) != 0) {
                  uVar21 = (uVar18 + uVar21 * 10) - 0x30;
                  bVar14 = *pbVar23;
                  uVar18 = (ulong)bVar14;
                  if (((globals_struct<void>::s_parse_flags[bVar14] & 8) == 0) ||
                     (0xccccccccccccccb < uVar21)) goto LAB_00105fe1;
                  uVar21 = ((ulong)bVar14 + uVar21 * 10) - 0x30;
                  uVar18 = (ulong)pbVar23[1];
                  pbVar23 = pbVar23 + 2;
                  if (0xccccccccccccccb < uVar21) break;
                }
                pbVar23 = pbVar23 + -1;
LAB_00105fe1:
                bVar14 = (byte)uVar18;
                if ((globals_struct<void>::s_parse_flags[uVar18] & 0x10) == 0) {
                  *(undefined4 *)(unaff_R15 + 2) = 2;
                  *unaff_R15 = (double)((uVar21 ^ -(ulong)(cVar27 == '-')) + uVar26);
                }
                else {
                  auVar34._8_4_ = (int)(uVar21 >> 0x20);
                  auVar34._0_8_ = uVar21;
                  auVar34._12_4_ = 0x45300000;
                  dVar4 = (auVar34._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar21) - 4503599627370496.0);
                  if ((globals_struct<void>::s_parse_flags[uVar18] & 8) != 0) {
                    pbVar30 = pbVar23 + 1;
                    do {
                      pbVar23 = pbVar30;
                      dVar4 = dVar4 * 10.0 + (double)((int)uVar18 + -0x30);
                      bVar14 = *pbVar23;
                      if ((globals_struct<void>::s_parse_flags[bVar14] & 8) == 0) goto LAB_0010607c;
                      dVar4 = dVar4 * 10.0 + (double)(int)(bVar14 - 0x30);
                      bVar14 = pbVar23[1];
                      uVar18 = (ulong)bVar14;
                      pbVar30 = pbVar23 + 2;
                    } while ((globals_struct<void>::s_parse_flags[uVar18] & 8) != 0);
                    pbVar23 = pbVar23 + 1;
                  }
LAB_0010607c:
                  iVar20 = 0;
                  if (bVar14 == 0x2e) {
                    bVar14 = pbVar23[1];
                    uVar18 = (ulong)bVar14;
                    pbVar23 = pbVar23 + 1;
                    if ((globals_struct<void>::s_parse_flags[uVar18] & 8) == 0) goto LAB_00106091;
                    uVar24 = 0;
                    do {
                      dVar4 = dVar4 * 10.0 + (double)((int)uVar18 + -0x30);
                      bVar14 = pbVar23[1];
                      if ((globals_struct<void>::s_parse_flags[bVar14] & 8) == 0) {
                        uVar24 = ~uVar24;
                        pbVar23 = pbVar23 + 1;
                        goto LAB_00106093;
                      }
                      dVar4 = dVar4 * 10.0 + (double)(int)(bVar14 - 0x30);
                      bVar14 = pbVar23[2];
                      uVar18 = (ulong)bVar14;
                      pbVar23 = pbVar23 + 2;
                      uVar24 = uVar24 + 2;
                    } while ((globals_struct<void>::s_parse_flags[uVar18] & 8) != 0);
                    uVar24 = -uVar24;
                  }
                  else {
LAB_00106091:
                    uVar24 = 0;
                  }
LAB_00106093:
                  iVar15 = 1;
                  if ((bVar14 & 0xdf) == 0x45) {
                    bVar14 = pbVar23[1];
                    if (bVar14 == 0x2d) {
                      iVar15 = -1;
LAB_0010610f:
                      bVar14 = pbVar23[2];
                      pbVar23 = pbVar23 + 2;
                    }
                    else {
                      iVar15 = 1;
                      if (bVar14 == 0x2b) goto LAB_0010610f;
                      pbVar23 = pbVar23 + 1;
                      iVar15 = 1;
                    }
                    uVar18 = (ulong)bVar14;
                    if ((globals_struct<void>::s_parse_flags[uVar18] & 8) != 0) {
                      iVar20 = 0;
                      pbVar30 = pbVar23;
                      do {
                        if (0xccccccb < iVar20) {
                          this->m_pStr = pbVar23;
                          (this->m_error_info).m_ofs = (long)pbVar30 - (long)this->m_pStart;
                          (this->m_error_info).m_pError_message = "Failed parsing numeric value";
                          bVar32 = false;
                          local_6c = 0;
                          goto LAB_001061f1;
                        }
                        iVar20 = (uint)(byte)uVar18 + iVar20 * 10 + -0x30;
                        uVar18 = (ulong)pbVar23[1];
                        pbVar23 = pbVar23 + 1;
                        pbVar30 = pbVar30 + 1;
                      } while ((globals_struct<void>::s_parse_flags[uVar18] & 8) != 0);
                    }
                  }
                  fVar1 = deserialize_internal::s_neg[uVar26];
                  iVar20 = iVar15 * iVar20 + uVar24;
                  if ((long)iVar20 + 0x1fU < 0x3f) {
                    dVar33 = *(double *)
                              (globals_struct<void>::s_pow10_table + (long)iVar20 * 8 + 0xf8);
                  }
                  else {
                    dVar33 = pow(10.0,(double)iVar20);
                  }
                  *(undefined4 *)(unaff_R15 + 2) = 3;
                  *unaff_R15 = dVar4 * (double)fVar1 * dVar33;
                }
                *(byte **)((long)unaff_R15 + 0x1c) = pbVar23;
              }
              bVar32 = true;
LAB_001061f1:
              if (bVar32) goto LAB_001061fa;
              bVar32 = false;
              goto LAB_001053a8;
            }
            if (uVar26 == 0x2e) {
LAB_00105a25:
              pbVar23 = pbVar30 + 1;
              *(uint *)(unaff_R15 + 2) = (cVar27 == '{') + 5;
              *(int *)(unaff_R15 + 1) = iVar22;
              *unaff_R15 = dVar28;
              bVar31 = cVar27 + 2;
              iVar22 = 0;
              dVar28 = (double)(ulong)(cVar27 == '{');
              goto LAB_001061fa;
            }
            if (uVar26 == 0x39) {
              if ((((pbVar30[1] != 0x61) || (pbVar30[2] != 0x6c)) || (pbVar30[3] != 0x73)) ||
                 (pbVar30[4] != 0x65)) goto LAB_00105a5d;
              pbVar23 = pbVar30 + 5;
              *(undefined4 *)(unaff_R15 + 2) = 1;
              *unaff_R15 = 0.0;
              unaff_R15[1] = 0.0;
              goto LAB_001061fa;
            }
          }
          if (uVar24 == 0) {
            this->m_pStr = pbVar30;
            (this->m_error_info).m_ofs = (long)pbVar30 - (long)this->m_pStart;
            pcVar12 = "Premature end of string (expected name or value)";
          }
          else {
            if (uVar24 == 0x22) {
              uVar26 = (ulong)pbVar30[1];
              if ((globals_struct<void>::s_parse_flags[uVar26] & 1) == 0) {
                pbVar13 = pbVar30 + 5;
                do {
                  pbVar23 = pbVar13;
                  uVar26 = (ulong)pbVar23[-3];
                  if ((globals_struct<void>::s_parse_flags[uVar26] & 1) != 0) {
                    pbVar23 = pbVar23 + -2;
                    goto LAB_00105bf0;
                  }
                  uVar26 = (ulong)pbVar23[-2];
                  if ((globals_struct<void>::s_parse_flags[uVar26] & 1) != 0) {
                    pbVar23 = pbVar23 + -1;
                    goto LAB_00105bf0;
                  }
                  uVar26 = (ulong)pbVar23[-1];
                  if ((globals_struct<void>::s_parse_flags[uVar26] & 1) != 0) goto LAB_00105bf0;
                  uVar26 = (ulong)*pbVar23;
                  pbVar13 = pbVar23 + 4;
                } while ((globals_struct<void>::s_parse_flags[uVar26] & 1) == 0);
                pbVar23 = pbVar23 + 1;
              }
              else {
                pbVar23 = pbVar30 + 2;
              }
LAB_00105bf0:
              pbVar13 = pbVar23 + -1;
              cVar27 = (char)uVar26;
              while (cVar27 != '\"') {
                if ((globals_struct<void>::s_parse_flags[uVar26] & 2) != 0) {
                  this->m_pStr = pbVar23;
                  (this->m_error_info).m_ofs = (long)pbVar23 - (long)this->m_pStart;
                  (this->m_error_info).m_pError_message = "Missing end quote";
                  local_6c = 0;
                  goto LAB_00105f13;
                }
                pbVar11 = pbVar23 + 1;
                bVar14 = *pbVar23;
                if (bVar14 < 0x62) {
                  if (bVar14 < 0x2f) {
                    if (bVar14 == 0x22) goto LAB_00105dcb;
                    if (bVar14 == 0) {
                      this->m_pStr = pbVar11;
                      (this->m_error_info).m_ofs = (long)pbVar11 - (long)this->m_pStart;
                      (this->m_error_info).m_pError_message = "Incomplete string escape";
                      local_6c = 0;
                      pbVar23 = pbVar11;
                      goto LAB_00105f13;
                    }
switchD_00105c6c_caseD_6f:
                    *pbVar13 = 0x5c;
                    pbVar13 = pbVar13 + 1;
                  }
                  else if ((bVar14 != 0x2f) && (bVar14 != 0x5c)) goto switchD_00105c6c_caseD_6f;
                }
                else {
                  switch(bVar14) {
                  case 0x6e:
                    bVar14 = 10;
                    break;
                  case 0x6f:
                  case 0x70:
                  case 0x71:
                  case 0x73:
                    goto switchD_00105c6c_caseD_6f;
                  case 0x72:
                    bVar14 = 0xd;
                    break;
                  case 0x74:
                    bVar14 = 9;
                    break;
                  case 0x75:
                    pbVar25 = pbVar23 + 2;
                    puVar10 = this->m_pStart;
                    lVar29 = 0;
                    bVar32 = false;
                    uVar24 = 0;
                    pbVar11 = pbVar25;
                    do {
                      pbVar23 = pbVar11;
                      uVar24 = uVar24 * 0x10;
                      bVar14 = pbVar23[-1];
                      if ((byte)(bVar14 + 0xbf) < 6) {
                        uVar24 = (uVar24 + bVar14) - 0x37;
LAB_00105d25:
                        bVar9 = true;
                      }
                      else {
                        if ((byte)(bVar14 + 0x9f) < 6) {
                          uVar24 = (uVar24 + bVar14) - 0x57;
                          goto LAB_00105d25;
                        }
                        if ((byte)(bVar14 - 0x30) < 10) {
                          uVar24 = (uVar24 + bVar14) - 0x30;
                          goto LAB_00105d25;
                        }
                        this->m_pStr = pbVar23;
                        (this->m_error_info).m_ofs = (size_t)(pbVar25 + (lVar29 - (long)puVar10));
                        (this->m_error_info).m_pError_message = "Invalid Unicode escape";
                        bVar9 = false;
                        local_6c = 0;
                      }
                      if (!bVar9) break;
                      bVar32 = 2 < (uint)lVar29;
                      lVar29 = lVar29 + 1;
                      pbVar11 = pbVar23 + 1;
                    } while ((int)lVar29 != 4);
                    if (bVar32) {
                      uVar26 = (ulong)(3 - (uVar24 < 0x800));
                      if (uVar24 - 1 < 0x7f) {
                        uVar26 = 1;
                      }
                      pbVar13 = pbVar13 + uVar26;
                      pbVar11 = pbVar13;
                      if ((int)uVar26 != 1) {
                        if ((int)uVar26 != 2) {
                          pbVar13[-1] = (byte)uVar24 & 0x3f | 0x80;
                          uVar24 = uVar24 >> 6;
                          pbVar11 = pbVar13 + -1;
                        }
                        pbVar11[-1] = (byte)uVar24 & 0x3f | 0x80;
                        uVar24 = uVar24 >> 6;
                        pbVar11 = pbVar11 + -1;
                      }
                      pbVar11[-1] = (byte)uVar24 | ""[uVar26];
                    }
                    if (bVar32) goto LAB_00105dd1;
                    goto LAB_00105f13;
                  default:
                    if (bVar14 == 0x62) {
                      bVar14 = 8;
                    }
                    else {
                      if (bVar14 != 0x66) goto switchD_00105c6c_caseD_6f;
                      bVar14 = 0xc;
                    }
                  }
                }
LAB_00105dcb:
                *pbVar13 = bVar14;
                pbVar13 = pbVar13 + 1;
                pbVar23 = pbVar11;
LAB_00105dd1:
                uVar26 = (ulong)*pbVar23;
                if ((globals_struct<void>::s_parse_flags[uVar26] & 1) == 0) {
                  lVar29 = 0;
                  do {
                    lVar17 = lVar29;
                    pbVar13[lVar17] = (byte)uVar26;
                    uVar26 = (ulong)pbVar23[lVar17 + 1];
                    if ((globals_struct<void>::s_parse_flags[uVar26] & 1) != 0) {
                      pbVar23 = pbVar23 + lVar17 + 2;
                      pbVar13 = pbVar13 + lVar17 + 1;
                      goto LAB_00105e6d;
                    }
                    pbVar13[lVar17 + 1] = pbVar23[lVar17 + 1];
                    uVar26 = (ulong)pbVar23[lVar17 + 2];
                    if ((globals_struct<void>::s_parse_flags[uVar26] & 1) != 0) {
                      pbVar23 = pbVar23 + lVar17 + 3;
                      pbVar13 = pbVar13 + lVar17 + 2;
                      goto LAB_00105e6d;
                    }
                    pbVar13[lVar17 + 2] = pbVar23[lVar17 + 2];
                    uVar26 = (ulong)pbVar23[lVar17 + 3];
                    if ((globals_struct<void>::s_parse_flags[uVar26] & 1) != 0) {
                      pbVar23 = pbVar23 + lVar17 + 4;
                      pbVar13 = pbVar13 + lVar17 + 3;
                      goto LAB_00105e6d;
                    }
                    pbVar13[lVar17 + 3] = pbVar23[lVar17 + 3];
                    uVar26 = (ulong)pbVar23[lVar17 + 4];
                    lVar29 = lVar17 + 4;
                  } while ((globals_struct<void>::s_parse_flags[uVar26] & 1) == 0);
                  pbVar23 = pbVar23 + lVar17 + 5;
                  pbVar13 = pbVar13 + lVar17 + 4;
                }
                else {
                  pbVar23 = pbVar23 + 1;
                }
LAB_00105e6d:
                cVar27 = (char)uVar26;
              }
              pbVar30 = pbVar30 + 1;
              *pbVar13 = 0;
              *(undefined4 *)(unaff_R15 + 2) = 4;
              *unaff_R15 = (double)pbVar30;
              *(int *)(unaff_R15 + 1) = ((int)pbVar13 - (int)pbVar30) + 1;
              *(byte **)((long)unaff_R15 + 0x14) = pbVar30;
              *(byte **)((long)unaff_R15 + 0x1c) = pbVar13;
LAB_00105f13:
              if (cVar27 == '\"') goto LAB_001061fa;
              bVar32 = false;
              goto LAB_001053a8;
            }
LAB_00105a5d:
            this->m_pStr = pbVar30;
            (this->m_error_info).m_ofs = (long)pbVar30 - (long)this->m_pStart;
            pcVar12 = "Unrecognized character";
          }
          (this->m_error_info).m_pError_message = pcVar12;
          bVar32 = false;
          local_6c = 0;
        }
        else {
          if (uVar24 == 0x6e) {
            if (((pbVar30[1] != 0x75) || (pbVar30[2] != 0x6c)) || (pbVar30[3] != 0x6c)) {
LAB_00105b32:
              this->m_pStr = pbVar30;
              (this->m_error_info).m_ofs = (long)pbVar30 - (long)this->m_pStart;
              pcVar12 = "Unrecognized character";
              goto LAB_00105397;
            }
            pbVar23 = pbVar30 + 4;
            *unaff_R15 = 0.0;
            unaff_R15[1] = 0.0;
            *(undefined4 *)(unaff_R15 + 2) = 0;
          }
          else {
            if (uVar24 != 0x74) {
              if (uVar24 == 0x7b) goto LAB_00105a25;
              goto LAB_00105a5d;
            }
            if (((pbVar30[1] != 0x72) || (pbVar30[2] != 0x75)) || (pbVar30[3] != 0x65))
            goto LAB_00105b32;
            pbVar23 = pbVar30 + 4;
            *(undefined4 *)(unaff_R15 + 2) = 1;
            *unaff_R15 = 0.0;
            unaff_R15[1] = 0.0;
            *unaff_R15 = 4.94065645841247e-324;
          }
LAB_001061fa:
          bVar32 = true;
        }
      }
      else {
        if ((char)uVar24 != '\"') {
          this->m_pStr = pbVar23;
          (this->m_error_info).m_ofs = (long)pbVar23 - (long)this->m_pStart;
          pcVar12 = "Expected quoted key string";
          goto LAB_00105397;
        }
        uVar26 = (ulong)pbVar23[1];
        if ((globals_struct<void>::s_parse_flags[uVar26] & 1) == 0) {
          pbVar13 = pbVar23 + 5;
          do {
            pbVar30 = pbVar13;
            uVar26 = (ulong)pbVar30[-3];
            if ((globals_struct<void>::s_parse_flags[uVar26] & 1) != 0) {
              pbVar30 = pbVar30 + -2;
              goto LAB_001053da;
            }
            uVar26 = (ulong)pbVar30[-2];
            if ((globals_struct<void>::s_parse_flags[uVar26] & 1) != 0) {
              pbVar30 = pbVar30 + -1;
              goto LAB_001053da;
            }
            uVar26 = (ulong)pbVar30[-1];
            if ((globals_struct<void>::s_parse_flags[uVar26] & 1) != 0) goto LAB_001053da;
            uVar26 = (ulong)*pbVar30;
            pbVar13 = pbVar30 + 4;
          } while ((globals_struct<void>::s_parse_flags[uVar26] & 1) == 0);
          pbVar30 = pbVar30 + 1;
        }
        else {
          pbVar30 = pbVar23 + 2;
        }
LAB_001053da:
        pbVar13 = pbVar30 + -1;
        cVar27 = (char)uVar26;
        while (cVar27 != '\"') {
          if ((globals_struct<void>::s_parse_flags[uVar26] & 2) != 0) {
            this->m_pStr = pbVar30;
            (this->m_error_info).m_ofs = (long)pbVar30 - (long)this->m_pStart;
            pcVar12 = "Missing end quote";
            pbVar11 = pbVar30;
            goto LAB_0010587b;
          }
          pbVar11 = pbVar30 + 1;
          bVar14 = *pbVar30;
          uVar24 = (uint)bVar14;
          if (bVar14 < 0x62) {
            if (bVar14 < 0x2f) {
              if (bVar14 != 0x22) {
                if (bVar14 != 0) {
switchD_001054ad_caseD_6f:
                  *pbVar13 = 0x5c;
                  pbVar13 = pbVar13 + 1;
                  goto LAB_001055f8;
                }
                this->m_pStr = pbVar11;
                (this->m_error_info).m_ofs = (long)pbVar11 - (long)this->m_pStart;
                (this->m_error_info).m_pError_message = "Incomplete string escape";
                uVar24 = (uint)bVar14;
                goto LAB_00105884;
              }
            }
            else if ((bVar14 != 0x2f) && (bVar14 != 0x5c)) goto switchD_001054ad_caseD_6f;
          }
          else {
            switch(bVar14) {
            case 0x6e:
              bVar14 = 10;
              break;
            case 0x6f:
            case 0x70:
            case 0x71:
            case 0x73:
              goto switchD_001054ad_caseD_6f;
            case 0x72:
              bVar14 = 0xd;
              break;
            case 0x74:
              bVar14 = 9;
              break;
            case 0x75:
              puVar10 = this->m_pStart;
              lVar29 = 0;
              bVar32 = false;
              uVar19 = 0;
              pbVar25 = pbVar30 + 2;
              do {
                pbVar11 = pbVar25;
                uVar19 = uVar19 * 0x10;
                bVar14 = pbVar11[-1];
                if ((byte)(bVar14 + 0xbf) < 6) {
                  uVar19 = (uVar19 + bVar14) - 0x37;
LAB_0010555d:
                  bVar9 = true;
                }
                else {
                  if ((byte)(bVar14 + 0x9f) < 6) {
                    uVar19 = (uVar19 + bVar14) - 0x57;
                    goto LAB_0010555d;
                  }
                  if ((byte)(bVar14 - 0x30) < 10) {
                    uVar19 = (uVar19 + bVar14) - 0x30;
                    goto LAB_0010555d;
                  }
                  this->m_pStr = pbVar11;
                  (this->m_error_info).m_ofs = (size_t)(pbVar30 + 2 + (lVar29 - (long)puVar10));
                  (this->m_error_info).m_pError_message = "Invalid Unicode escape";
                  bVar9 = false;
                  local_6c = 0;
                }
                if (!bVar9) break;
                bVar32 = 2 < (uint)lVar29;
                lVar29 = lVar29 + 1;
                pbVar25 = pbVar11 + 1;
              } while ((int)lVar29 != 4);
              if (bVar32) {
                uVar26 = (ulong)(3 - (uVar19 < 0x800));
                if (uVar19 - 1 < 0x7f) {
                  uVar26 = 1;
                }
                pbVar13 = pbVar13 + uVar26;
                pbVar30 = pbVar13;
                if ((int)uVar26 != 1) {
                  if ((int)uVar26 != 2) {
                    pbVar13[-1] = (byte)uVar19 & 0x3f | 0x80;
                    uVar19 = uVar19 >> 6;
                    pbVar30 = pbVar13 + -1;
                  }
                  pbVar30[-1] = (byte)uVar19 & 0x3f | 0x80;
                  uVar19 = uVar19 >> 6;
                  pbVar30 = pbVar30 + -1;
                }
                pbVar30[-1] = (byte)uVar19 | ""[uVar26];
              }
              if (bVar32) goto LAB_001055ff;
              bVar32 = false;
              pbVar23 = pbVar11;
              goto LAB_0010588c;
            default:
              if (bVar14 == 0x62) {
                bVar14 = 8;
              }
              else {
                if (bVar14 != 0x66) goto switchD_001054ad_caseD_6f;
                bVar14 = 0xc;
              }
            }
          }
LAB_001055f8:
          *pbVar13 = bVar14;
          pbVar13 = pbVar13 + 1;
LAB_001055ff:
          uVar26 = (ulong)*pbVar11;
          if ((globals_struct<void>::s_parse_flags[uVar26] & 1) == 0) {
            lVar29 = 0;
            do {
              lVar17 = lVar29;
              pbVar13[lVar17] = (byte)uVar26;
              uVar26 = (ulong)pbVar11[lVar17 + 1];
              if ((globals_struct<void>::s_parse_flags[uVar26] & 1) != 0) {
                pbVar30 = pbVar11 + lVar17 + 2;
                pbVar13 = pbVar13 + lVar17 + 1;
                goto LAB_0010569b;
              }
              pbVar13[lVar17 + 1] = pbVar11[lVar17 + 1];
              uVar26 = (ulong)pbVar11[lVar17 + 2];
              if ((globals_struct<void>::s_parse_flags[uVar26] & 1) != 0) {
                pbVar30 = pbVar11 + lVar17 + 3;
                pbVar13 = pbVar13 + lVar17 + 2;
                goto LAB_0010569b;
              }
              pbVar13[lVar17 + 2] = pbVar11[lVar17 + 2];
              uVar26 = (ulong)pbVar11[lVar17 + 3];
              if ((globals_struct<void>::s_parse_flags[uVar26] & 1) != 0) {
                pbVar30 = pbVar11 + lVar17 + 4;
                pbVar13 = pbVar13 + lVar17 + 3;
                goto LAB_0010569b;
              }
              pbVar13[lVar17 + 3] = pbVar11[lVar17 + 3];
              uVar26 = (ulong)pbVar11[lVar17 + 4];
              lVar29 = lVar17 + 4;
            } while ((globals_struct<void>::s_parse_flags[uVar26] & 1) == 0);
            pbVar30 = pbVar11 + lVar17 + 5;
            pbVar13 = pbVar13 + lVar17 + 4;
          }
          else {
            pbVar30 = pbVar11 + 1;
          }
LAB_0010569b:
          cVar27 = (char)uVar26;
        }
        *pbVar13 = 0;
        puVar10 = (this->m_stack).m_pBuf;
        uVar21 = (this->m_stack).m_size;
        sVar16 = (this->m_stack).m_ofs;
        uVar18 = sVar16 + 0x34;
        (this->m_stack).m_ofs = uVar18;
        if (uVar21 < uVar18) {
          (this->m_stack).m_ofs = sVar16;
          lVar29 = uVar21 * 2;
          uVar21 = lVar29 + (ulong)(lVar29 == 0);
          do {
            __size = uVar21;
            uVar21 = __size * 2;
          } while (__size <= uVar18);
          (this->m_stack).m_size = __size;
          puVar10 = (uint8 *)realloc(puVar10,__size);
          (this->m_stack).m_pBuf = puVar10;
          sVar16 = (this->m_stack).m_ofs;
          puVar10 = puVar10 + sVar16;
          (this->m_stack).m_ofs = sVar16 + 0x34;
        }
        else {
          puVar10 = puVar10 + sVar16;
        }
        if ((this->m_stack).m_size < (this->m_stack).m_ofs) {
          pcVar12 = "T *pjson::growable_stack::push(uint) [T = pjson::key_value_t]";
          goto LAB_001062f3;
        }
        *(byte **)puVar10 = pbVar23 + 1;
        *(int *)(puVar10 + 8) = ((int)pbVar13 + 1) - (int)(pbVar23 + 1);
        while ((globals_struct<void>::s_parse_flags[*pbVar30] & 4) != 0) {
          do {
            if ((globals_struct<void>::s_parse_flags[pbVar30[1]] & 4) == 0) {
              pbVar30 = pbVar30 + 1;
              break;
            }
            if ((globals_struct<void>::s_parse_flags[pbVar30[2]] & 4) == 0) {
              pbVar30 = pbVar30 + 2;
              break;
            }
            if ((globals_struct<void>::s_parse_flags[pbVar30[3]] & 4) == 0) {
              pbVar30 = pbVar30 + 3;
              break;
            }
            pbVar23 = pbVar30 + 4;
            pbVar30 = pbVar30 + 4;
          } while ((globals_struct<void>::s_parse_flags[*pbVar23] & 4) != 0);
          if ((*pbVar30 != 0x2f) || (pbVar30[1] != 0x2f)) break;
          pbVar30 = pbVar30 + 2;
          while ((0xd < *pbVar30 || ((0x2401U >> (*pbVar30 & 0x1f) & 1) == 0))) {
            pbVar30 = pbVar30 + 1;
          }
        }
        unaff_R15 = (double *)(puVar10 + 0x10);
        if (*pbVar30 == 0x3a) {
          bVar14 = pbVar30[1];
          pbVar23 = pbVar30 + 1;
          while ((globals_struct<void>::s_parse_flags[bVar14] & 4) != 0) {
            do {
              if ((globals_struct<void>::s_parse_flags[pbVar23[1]] & 4) == 0) {
                pbVar23 = pbVar23 + 1;
                break;
              }
              if ((globals_struct<void>::s_parse_flags[pbVar23[2]] & 4) == 0) {
                pbVar23 = pbVar23 + 2;
                break;
              }
              if ((globals_struct<void>::s_parse_flags[pbVar23[3]] & 4) == 0) {
                pbVar23 = pbVar23 + 3;
                break;
              }
              pbVar30 = pbVar23 + 4;
              pbVar23 = pbVar23 + 4;
            } while ((globals_struct<void>::s_parse_flags[*pbVar30] & 4) != 0);
            if ((*pbVar23 != 0x2f) || (pbVar23[1] != 0x2f)) break;
            pbVar23 = pbVar23 + 2;
            while ((0xd < *pbVar23 || ((0x2401U >> (*pbVar23 & 0x1f) & 1) == 0))) {
              pbVar23 = pbVar23 + 1;
            }
            bVar14 = *pbVar23;
          }
          uVar24 = (uint)*pbVar23;
          bVar32 = true;
        }
        else {
          this->m_pStr = pbVar30;
          (this->m_error_info).m_ofs = (long)pbVar30 - (long)this->m_pStart;
          pcVar12 = "Missing colon after key";
          pbVar11 = pbVar30;
LAB_0010587b:
          (this->m_error_info).m_pError_message = pcVar12;
          uVar24 = (uint)uVar26;
LAB_00105884:
          bVar32 = false;
          local_6c = 0;
          pbVar23 = pbVar11;
        }
LAB_0010588c:
        pbVar30 = pbVar23;
        if (bVar32) goto LAB_0010589d;
        bVar32 = false;
      }
    }
    else {
      if ((iVar22 == 0) || (bVar14 == bVar31)) goto LAB_00104fb1;
      this->m_pStr = pbVar23;
      (this->m_error_info).m_ofs = (long)pbVar23 - (long)this->m_pStart;
      pcVar12 = "Expected comma or object/array end character";
LAB_00105397:
      (this->m_error_info).m_pError_message = pcVar12;
LAB_001053a0:
      bVar32 = false;
      local_6c = 0;
    }
LAB_001053a8:
    if (!bVar32) {
      return (bool)((byte)local_6c & 1);
    }
  } while( true );
}

Assistant:

PJSON_FORCEINLINE T* push(uint num)
      {
         const size_t bytes_needed = sizeof(T) * num;
         T* pResult = reinterpret_cast<T*>(m_pBuf + m_ofs);
         m_ofs += bytes_needed;
         
         if (m_ofs > m_size)
         {
            m_ofs -= bytes_needed;
            
            m_size = PJSON_MAX(1, m_size * 2);
            while(m_size <= (m_ofs + bytes_needed))
               m_size *= 2;
            m_pBuf = static_cast<uint8*>(pjson_realloc(m_pBuf, m_size));

            pResult = reinterpret_cast<T*>(m_pBuf + m_ofs);
            m_ofs += bytes_needed;
         }
         
         PJSON_ASSERT(m_ofs <= m_size);
         return pResult;
      }